

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::CleanupToReparseHelper(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  LocalFunctionId functionId;
  BOOL BVar3;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  ScriptContext *pSVar4;
  ProxyEntryPointInfo **ppPVar5;
  FunctionEntryPointInfo *pFVar6;
  ByteBlock **ppBVar7;
  DynamicProfileInfo **ppDVar8;
  SourceContextInfo *pSVar9;
  SourceDynamicProfileManager **ppSVar10;
  SourceDynamicProfileManager *this_01;
  FunctionInfo *this_02;
  DynamicProfileInfo *pDVar11;
  FunctionBody *pFVar12;
  undefined4 *puVar13;
  AuxStatementData **ppAVar14;
  Recycler *this_03;
  nullptr_t local_68;
  nullptr_t local_60;
  nullptr_t local_58;
  Type *local_50;
  Type *info;
  EditingIterator iter;
  DynamicProfileInfoList *profileInfoList;
  SourceContextInfo *sourceContextInfo;
  nullptr_t local_18;
  FunctionBody *local_10;
  FunctionBody *this_local;
  
  local_10 = this;
  CleanupRecyclerData(this,false,true);
  this_00 = Memory::
            WriteBarrierPtr<Js::SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
            ::operator->(&this->entryPoints);
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  ::ClearAndZero(this_00);
  CreateNewDefaultEntryPoint(this);
  pSVar4 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  FunctionProxy::SetOriginalEntryPoint((FunctionProxy *)this,pSVar4->CurrentThunk);
  ppPVar5 = Memory::WriteBarrierPtr::operator_cast_to_ProxyEntryPointInfo__
                      ((WriteBarrierPtr *)
                       &(this->super_ParseableFunctionInfo).super_FunctionProxy.
                        m_defaultEntryPointInfo);
  if (*ppPVar5 != (ProxyEntryPointInfo *)0x0) {
    pFVar6 = GetDefaultFunctionEntryPointInfo(this);
    pFVar6->entryPointIndex = 0;
  }
  SetAuxiliaryData(this,(ByteBlock *)0x0);
  SetAuxiliaryContextData(this,(ByteBlock *)0x0);
  ppBVar7 = Memory::WriteBarrierPtr::operator_cast_to_ByteBlock__
                      ((WriteBarrierPtr *)&this->byteCodeBlock);
  if ((*ppBVar7 != (ByteBlock *)0x0) &&
     (bVar2 = ParseableFunctionInfo::IsWasmFunction(&this->super_ParseableFunctionInfo), bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1425,"(!this->byteCodeBlock || !this->IsWasmFunction())",
                                "We should never reset the bytecode block for Wasm");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  local_18 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ByteBlock>::operator=(&this->byteCodeBlock,&local_18);
  SetLoopHeaderArray(this,(LoopHeader *)0x0);
  SetConstTable(this,(Type *)0x0);
  SetCodeGenRuntimeData(this,(FunctionCodeGenRuntimeData **)0x0);
  sourceContextInfo = (SourceContextInfo *)0x0;
  Memory::WriteBarrierPtr<int>::operator=(&this->cacheIdToPropertyIdMap,&sourceContextInfo);
  SetFormalsPropIdArray(this,(PropertyIdArray *)0x0);
  SetReferencedPropertyIdMap(this,(PropertyId *)0x0);
  SetCallSiteToCallApplyCallSiteArray(this,(ProfileId *)0x0);
  SetLiteralRegexs(this,(RegexPattern **)0x0);
  SetSlotIdInCachedScopeToNestedIndexArray(this,(AuxArray<unsigned_int> *)0x0);
  SetStatementMaps(this,(StatementMapList *)0x0);
  SetCodeGenGetSetRuntimeData(this,(FunctionCodeGenRuntimeData **)0x0);
  SetPropertyIdOnRegSlotsContainer(this,(PropertyIdOnRegSlotsContainer *)0x0);
  this->profiledLdLenCount = 0;
  this->profiledLdElemCount = 0;
  this->profiledStElemCount = 0;
  this->profiledCallSiteCount = 0;
  this->profiledArrayCallSiteCount = 0;
  this->profiledDivOrRemCount = 0;
  this->profiledSwitchCount = 0;
  this->profiledReturnTypeCount = 0;
  this->profiledSlotCount = 0;
  SetLoopCount(this,0);
  this->m_envDepth = 0xffff;
  SetByteCodeCount(this,0);
  SetByteCodeWithoutLDACount(this,0);
  SetByteCodeInLoopCount(this,0);
  ppDVar8 = Memory::WriteBarrierPtr::operator_cast_to_DynamicProfileInfo__
                      ((WriteBarrierPtr *)&this->dynamicProfileInfo);
  if (*ppDVar8 != (DynamicProfileInfo *)0x0) {
    pSVar9 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this);
    if ((pSVar9 != (SourceContextInfo *)0x0) &&
       (ppSVar10 = Memory::WriteBarrierPtr::operator_cast_to_SourceDynamicProfileManager__
                             ((WriteBarrierPtr *)&pSVar9->sourceDynamicProfileManager),
       *ppSVar10 != (SourceDynamicProfileManager *)0x0)) {
      this_01 = Memory::WriteBarrierPtr<Js::SourceDynamicProfileManager>::operator->
                          (&pSVar9->sourceDynamicProfileManager);
      this_02 = FunctionProxy::GetFunctionInfo((FunctionProxy *)this);
      functionId = FunctionInfo::GetLocalFunctionId(this_02);
      SourceDynamicProfileManager::RemoveDynamicProfileInfo(this_01,functionId);
    }
    pSVar4 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
    iter.last = &ScriptContext::GetProfileInfoList(pSVar4)->super_SListNodeBase<Memory::Recycler>;
    if ((DynamicProfileInfoList *)iter.last != (DynamicProfileInfoList *)0x0) {
      SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::GetEditingIterator
                ((EditingIterator *)&info,
                 (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)iter.last);
      do {
        do {
          bVar2 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator
                  ::Next((EditingIterator *)&info);
          if (!bVar2) goto LAB_00a24689;
          local_50 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Iterator::
                     Data((Iterator *)&info);
          pDVar11 = Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator->(local_50);
          bVar2 = DynamicProfileInfo::HasFunctionBody(pDVar11);
        } while (!bVar2);
        pDVar11 = Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator->(local_50);
        pFVar12 = DynamicProfileInfo::GetFunctionBody(pDVar11);
      } while (pFVar12 != this);
      SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::
      UnlinkCurrent((EditingIterator *)&info);
    }
LAB_00a24689:
    local_58 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator=(&this->dynamicProfileInfo,&local_58);
  }
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffffeff;
  SetFirstTmpRegister(this,0xffffffff);
  SetVarCount(this,0);
  SetConstantCount(this,0);
  SetLocalClosureRegister(this,0xffffffff);
  SetParamClosureRegister(this,0xffffffff);
  SetLocalFrameDisplayRegister(this,0xffffffff);
  SetEnvRegister(this,0xffffffff);
  SetThisRegisterForEventHandler(this,0xffffffff);
  SetFirstInnerScopeRegister(this,0xffffffff);
  SetFuncExprScopeRegister(this,0xffffffff);
  SetInnerScopeCount(this,0);
  this->hasCachedScopePropIds = false;
  ResetObjectLiteralTypes(this);
  SetInlineCacheCount(this,0);
  SetRootObjectLoadInlineCacheStart(this,0);
  SetRootObjectLoadMethodInlineCacheStart(this,0);
  SetRootObjectStoreInlineCacheStart(this,0);
  SetIsInstInlineCacheCount(this,0);
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfff7ffff;
  SetReferencedPropertyIdCount(this,0);
  SetPolymorphicCallSiteInfoHead(this,(PolymorphicCallSiteInfo *)0x0);
  FunctionExecutionStateMachine::SetInterpretedCount(&this->executionState,0);
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xf7ffffff;
  SetDebuggerScopeIndex(this,0);
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0x7fffffff;
  this->m_asmJsTotalLoopCount = 0;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffdffff;
  SetLoopInterpreterLimit(this,DAT_01eace48);
  ReinitializeExecutionModeAndLimits(this);
  if ((this->m_sourceInfo).m_probeCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x148b,"(this->m_sourceInfo.m_probeCount == 0)",
                                "this->m_sourceInfo.m_probeCount == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  local_60 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ByteBlock>::operator=
            (&(this->m_sourceInfo).m_probeBackingBlock,&local_60);
  this->m_DEBUG_executionCount = 0;
  if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SmallSpanSequence>
              (&Memory::HeapAllocator::Instance,(this->m_sourceInfo).pSpanSequence);
    (this->m_sourceInfo).pSpanSequence = (Type)0x0;
  }
  ppAVar14 = Memory::WriteBarrierPtr::operator_cast_to_AuxStatementData__
                       ((WriteBarrierPtr *)&(this->m_sourceInfo).m_auxStatementData);
  if (*ppAVar14 != (AuxStatementData *)0x0) {
    this_03 = ScriptContext::GetRecycler
                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    ppAVar14 = Memory::WriteBarrierPtr::operator_cast_to_AuxStatementData__
                         ((WriteBarrierPtr *)&(this->m_sourceInfo).m_auxStatementData);
    BVar3 = Memory::Recycler::IsValidObject(this_03,*ppAVar14,0);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x149c,
                                  "(m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData))"
                                  ,
                                  "m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    local_68 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::FunctionBody::AuxStatementData>::operator=
              (&(this->m_sourceInfo).m_auxStatementData,&local_68);
  }
  return;
}

Assistant:

void FunctionBody::CleanupToReparseHelper()
    {
        this->CleanupRecyclerData(/* isShutdown */ false, true /* capture entry point cleanup stack trace */);

        this->entryPoints->ClearAndZero();

        // Store the originalEntryPoint to restore it back immediately.
        this->CreateNewDefaultEntryPoint();
        this->SetOriginalEntryPoint(this->GetScriptContext()->CurrentThunk);
        if (this->m_defaultEntryPointInfo)
        {
            this->GetDefaultFunctionEntryPointInfo()->entryPointIndex = 0;
        }

        this->SetAuxiliaryData(nullptr);
        this->SetAuxiliaryContextData(nullptr);
        AssertMsg(!this->byteCodeBlock || !this->IsWasmFunction(), "We should never reset the bytecode block for Wasm");
        this->byteCodeBlock = nullptr;
        this->SetLoopHeaderArray(nullptr);
        this->SetConstTable(nullptr);
        this->SetCodeGenRuntimeData(nullptr);
        this->cacheIdToPropertyIdMap = nullptr;
        this->SetFormalsPropIdArray(nullptr);
        this->SetReferencedPropertyIdMap(nullptr);
#if ENABLE_NATIVE_CODEGEN
        this->SetCallSiteToCallApplyCallSiteArray(nullptr);
#endif
        this->SetLiteralRegexs(nullptr);
        this->SetSlotIdInCachedScopeToNestedIndexArray(nullptr);
        this->SetStatementMaps(nullptr);
        this->SetCodeGenGetSetRuntimeData(nullptr);
        this->SetPropertyIdOnRegSlotsContainer(nullptr);
        this->profiledLdLenCount = 0;
        this->profiledLdElemCount = 0;
        this->profiledStElemCount = 0;
        this->profiledCallSiteCount = 0;
        this->profiledArrayCallSiteCount = 0;
        this->profiledDivOrRemCount = 0;
        this->profiledSwitchCount = 0;
        this->profiledReturnTypeCount = 0;
        this->profiledSlotCount = 0;
        this->SetLoopCount(0);

        this->m_envDepth = (uint16)-1;

        this->SetByteCodeCount(0);
        this->SetByteCodeWithoutLDACount(0);
        this->SetByteCodeInLoopCount(0);

#if ENABLE_PROFILE_INFO
        if (this->dynamicProfileInfo != nullptr)
        {
            SourceContextInfo * sourceContextInfo = GetSourceContextInfo();
            if(sourceContextInfo && sourceContextInfo->sourceDynamicProfileManager)
            {
                sourceContextInfo->sourceDynamicProfileManager->RemoveDynamicProfileInfo(GetFunctionInfo()->GetLocalFunctionId());
            }

#ifdef DYNAMIC_PROFILE_STORAGE
            DynamicProfileInfoList * profileInfoList = GetScriptContext()->GetProfileInfoList();
            if (profileInfoList)
            {
                FOREACH_SLISTBASE_ENTRY_EDITING(Field(DynamicProfileInfo*), info, profileInfoList, iter)
                {
                    if (info->HasFunctionBody() && info->GetFunctionBody() == this)
                    {
                        iter.UnlinkCurrent();
                        break;
                    }
                }
                NEXT_SLISTBASE_ENTRY_EDITING;
            }
#endif
        this->dynamicProfileInfo = nullptr;
        }
#endif
        this->hasExecutionDynamicProfileInfo = false;

        this->SetFirstTmpRegister(Constants::NoRegister);
        this->SetVarCount(0);
        this->SetConstantCount(0);
        this->SetLocalClosureRegister(Constants::NoRegister);
        this->SetParamClosureRegister(Constants::NoRegister);
        this->SetLocalFrameDisplayRegister(Constants::NoRegister);
        this->SetEnvRegister(Constants::NoRegister);
        this->SetThisRegisterForEventHandler(Constants::NoRegister);
        this->SetFirstInnerScopeRegister(Constants::NoRegister);
        this->SetFuncExprScopeRegister(Constants::NoRegister);
        this->SetInnerScopeCount(0);
        this->hasCachedScopePropIds = false;

        this->ResetObjectLiteralTypes();

        this->SetInlineCacheCount(0);
        this->SetRootObjectLoadInlineCacheStart(0);
        this->SetRootObjectLoadMethodInlineCacheStart(0);
        this->SetRootObjectStoreInlineCacheStart(0);
        this->SetIsInstInlineCacheCount(0);
        this->m_inlineCachesOnFunctionObject = false;
        this->SetReferencedPropertyIdCount(0);
#if ENABLE_PROFILE_INFO
        this->SetPolymorphicCallSiteInfoHead(nullptr);
#endif

        this->executionState.SetInterpretedCount(0);

        this->m_hasDoneAllNonLocalReferenced = false;

        this->SetDebuggerScopeIndex(0);

        this->m_isAsmJsScheduledForFullJIT = false;
        this->m_asmJsTotalLoopCount = 0;

        recentlyBailedOutOfJittedLoopBody = false;

        SetLoopInterpreterLimit(CONFIG_FLAG(LoopInterpretCount));
        ReinitializeExecutionModeAndLimits();

        Assert(this->m_sourceInfo.m_probeCount == 0);
        this->m_sourceInfo.m_probeBackingBlock = nullptr;

#if DBG
        // This could be non-zero if the function threw exception before. Reset it.
        this->m_DEBUG_executionCount = 0;
#endif
        if (this->m_sourceInfo.pSpanSequence != nullptr)
        {
            HeapDelete(this->m_sourceInfo.pSpanSequence);
            this->m_sourceInfo.pSpanSequence = nullptr;
        }

        if (this->m_sourceInfo.m_auxStatementData != nullptr)
        {
            // This must be consistent with how we allocate the data for this and inner structures.
            // We are using recycler, thus it's enough just to set to NULL.
            Assert(m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData));
            m_sourceInfo.m_auxStatementData = nullptr;
        }
    }